

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O2

ostream * tcu::Format::operator<<
                    (ostream *str,
                    Array<const_deqp::gles3::Functional::TransformFeedback::DrawCall_*> *fmt)

{
  DrawCall *call;
  
  std::operator<<(str,"{ ");
  for (call = fmt->begin; call != fmt->end; call = call + 1) {
    if (call != fmt->begin) {
      std::operator<<(str,", ");
    }
    deqp::gles3::Functional::TransformFeedback::operator<<(str,call);
  }
  std::operator<<(str," }");
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const Array<Iterator>& fmt)
{
	str << "{ ";
	for (Iterator cur = fmt.begin; cur != fmt.end; ++cur)
	{
		if (cur != fmt.begin)
			str << ", ";
		str << *cur;
	}
	str << " }";
	return str;
}